

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<char>::typed_array<double_const>
          (basic_json_visitor<char> *this,span<const_double,_18446744073709551615UL> *data,
          semantic_tag tag,ser_context *context)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  long *in_RCX;
  undefined1 in_DL;
  undefined8 in_RSI;
  long *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  std::error_code::error_code(in_stack_ffffffffffffff90);
  (**(code **)(*in_RDI + 0xe8))(in_RDI,in_RSI,in_DL,in_RCX,&stack0xffffffffffffffd0);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    return true;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  iVar3 = in_stack_ffffffffffffffd0;
  uVar4 = in_stack_ffffffffffffffd4;
  (**(code **)(*in_RCX + 0x10))();
  (**(code **)(*in_RCX + 0x18))();
  ec_00._M_cat._0_4_ = iVar3;
  ec_00._0_8_ = in_stack_ffffffffffffffc8;
  ec_00._M_cat._4_4_ = uVar4;
  ser_error::ser_error
            ((ser_error *)CONCAT44(uStack_24,uStack_28),ec_00,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffb0
            );
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE typed_array(const jsoncons::span<T>& data, 
            semantic_tag tag=semantic_tag::none,
            const ser_context& context=ser_context())
        {
            std::error_code ec;
            visit_typed_array(data, tag, context, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, context.line(), context.column()));
            }
            JSONCONS_VISITOR_RETURN;
        }